

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_count(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char buf [4608];
  DESCRIPTOR_DATA *d;
  int count;
  int not_seen;
  char acStackY_1228 [16];
  CHAR_DATA *in_stack_ffffffffffffede8;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  DESCRIPTOR_DATA *local_20;
  uint local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  for (local_20 = descriptor_list; local_20 != (DESCRIPTOR_DATA *)0x0; local_20 = local_20->next) {
    if (local_20->connected == 0) {
      bVar1 = can_see(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      if ((!bVar1) || (bVar1 = is_switched(local_20->character), bVar1)) {
        local_14 = local_14 + 1;
      }
      else {
        local_18 = local_18 + 1;
      }
    }
  }
  if ((int)count_data[0] <= (int)(local_18 + local_14)) {
    count_data[0] = (short)local_18 + (short)local_14;
  }
  sprintf(acStackY_1228,"There are %d characters on that you can see.\n\r",(ulong)local_18);
  send_to_char((char *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
  return;
}

Assistant:

void do_count(CHAR_DATA *ch, char *argument)
{
	auto not_seen = 0;
	auto count = 0;

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING)
		{
			if (can_see(ch, d->character) && !is_switched(d->character))
				count++;
			else
				not_seen++;
		}
	}

	if ((count + not_seen) >= count_data[0])
		count_data[0] = count + not_seen;

	char buf[MAX_STRING_LENGTH];
	sprintf(buf, "There are %d characters on that you can see.\n\r", count);
	send_to_char(buf, ch);
}